

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_scandir_empty_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_1d8 [4];
  int r;
  uv_dirent_t dent;
  uv_fs_t req;
  char *path;
  
  loop = uv_default_loop();
  uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)&dent.type,"./empty_dir/",0x1ff,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)&dent.type);
  memset(&dent.type,0xdb,0x1b8);
  iVar1 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)&dent.type,"./empty_dir/",0,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa4b,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa4c,"req.result == 0");
    abort();
  }
  if (req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa4d,"req.ptr == NULL");
    abort();
  }
  iVar1 = uv_fs_scandir_next((uv_fs_t *)&dent.type,(uv_dirent_t *)local_1d8);
  if (iVar1 != -0xfff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa4e,"UV_EOF == uv_fs_scandir_next(&req, &dent)");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&dent.type);
  iVar1 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa52,"r == 0");
    abort();
  }
  if (scandir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa54,"scandir_cb_count == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (scandir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa56,"scandir_cb_count == 1");
    abort();
  }
  uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)&dent.type,"./empty_dir/",(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)&dent.type);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xa5b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_EOF == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}